

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBinPacker.cxx
# Opt level: O2

bool __thiscall
cmCTestBinPackerAllocation::operator==
          (cmCTestBinPackerAllocation *this,cmCTestBinPackerAllocation *other)

{
  __type _Var1;
  
  if ((this->ProcessIndex == other->ProcessIndex) && (this->SlotsNeeded == other->SlotsNeeded)) {
    _Var1 = std::operator==(&this->Id,&other->Id);
    return _Var1;
  }
  return false;
}

Assistant:

bool cmCTestBinPackerAllocation::operator==(
  const cmCTestBinPackerAllocation& other) const
{
  return this->ProcessIndex == other.ProcessIndex &&
    this->SlotsNeeded == other.SlotsNeeded && this->Id == other.Id;
}